

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal.cc
# Opt level: O3

wal_item * wal_itr_last(wal_iterator *wal_itr)

{
  snap_handle *psVar1;
  avl_node *paVar2;
  wal_item *pwVar3;
  
  psVar1 = wal_itr->shandle;
  if (psVar1->is_persisted_snapshot == true) {
    if (wal_itr->by_key == true) {
      paVar2 = avl_last(&psVar1->key_tree);
      wal_itr->cursor_pos = paVar2;
      pwVar3 = (wal_item *)&paVar2[-5].right;
    }
    else {
      paVar2 = avl_last(&psVar1->seq_tree);
      wal_itr->cursor_pos = paVar2;
      pwVar3 = (wal_item *)&paVar2[-1].left;
    }
    if (paVar2 == (avl_node *)0x0) {
      pwVar3 = (wal_item *)0x0;
    }
  }
  else {
    if (psVar1->snap_tag_idx != 0) {
      wal_itr->direction = '\x02';
      if (wal_itr->by_key != true) {
        pwVar3 = _wal_itr_search_smaller_byseq(wal_itr,(wal_item *)0x0);
        return pwVar3;
      }
      pwVar3 = _wal_itr_last_bykey(wal_itr);
      return pwVar3;
    }
    pwVar3 = (wal_item *)0x0;
  }
  return pwVar3;
}

Assistant:

struct wal_item* wal_itr_last(struct wal_iterator *wal_itr) {
    if (wal_itr->shandle->is_persisted_snapshot) {
        struct avl_node *a;
        if (wal_itr->by_key) {
            a = avl_last(&wal_itr->shandle->key_tree);
            wal_itr->cursor_pos = a;
            return a ? _get_entry(a, struct wal_item, avl_keysnap) : NULL;
        } else {
            a = avl_last(&wal_itr->shandle->seq_tree);
            wal_itr->cursor_pos = a;
            return a ? _get_entry(a, struct wal_item, avl_seq) : NULL;
        }
    }

    if (wal_itr->shandle->snap_tag_idx) { // no items in WAL in snapshot..
        wal_itr->direction = FDB_ITR_REVERSE;
        if (wal_itr->by_key) {
            return _wal_itr_last_bykey(wal_itr);
        } else {
            return _wal_itr_last_byseq(wal_itr);
        }
    }
    return NULL;
}